

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests_impl.h
# Opt level: O2

int memcmp_and_randomize(uchar *value,uchar *expected,size_t len)

{
  int iVar1;
  uint64_t uVar2;
  size_t sVar3;
  
  iVar1 = secp256k1_memcmp_var(value,expected,len);
  for (sVar3 = 0; len != sVar3; sVar3 = sVar3 + 1) {
    uVar2 = testrand64();
    value[sVar3] = (uchar)(uVar2 >> 0x38);
  }
  return iVar1;
}

Assistant:

int memcmp_and_randomize(unsigned char *value, const unsigned char *expected, size_t len) {
    int ret;
    size_t i;
    ret = secp256k1_memcmp_var(value, expected, len);
    for (i = 0; i < len; i++) {
        value[i] = testrand_bits(8);
    }
    return ret;
}